

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  undefined2 uVar5;
  Parse *pParse;
  SrcList *pSVar6;
  undefined4 uVar7;
  byte bVar8;
  i8 iVar9;
  LogEst LVar10;
  LogEst LVar11;
  short sVar12;
  int iVar13;
  int extraout_EAX;
  WherePath *p;
  LogEst *pLVar14;
  WhereLoop **ppWVar15;
  uint uVar16;
  uint uVar17;
  WhereLoop ***pppWVar18;
  ulong uVar19;
  short sVar20;
  WhereLoop *pWVar21;
  long lVar22;
  short sVar23;
  WhereLoop *pWVar24;
  WherePath *pWVar25;
  uint uVar26;
  ulong uVar27;
  ExprList *pOrderBy;
  ulong uVar28;
  ulong uVar29;
  short sVar30;
  undefined4 uVar31;
  short sVar32;
  int iVar33;
  WherePath *pWVar34;
  WherePath *pPath;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  long in_FS_OFFSET;
  uint local_f0;
  WhereLoop **local_c8;
  WherePath *local_c0;
  Bitmask revMask;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  bVar2 = pWInfo->nLevel;
  uVar37 = (ulong)bVar2;
  uVar36 = 1;
  if (1 < bVar2) {
    if (bVar2 == 2) {
      uVar36 = 5;
    }
    else if (pParse->nErr == 0) {
      if (((4 < bVar2) && ((pWInfo->field_0x44 & 0x10) == 0)) &&
         ((pParse->db->dbOptFlags & 0x20000000) == 0)) {
        uVar19 = 1;
        pWInfo->field_0x44 = pWInfo->field_0x44 | 0x10;
        pSVar6 = pWInfo->pTabList;
        pWVar21 = pWInfo->pLoops;
        uVar28 = 0;
        for (uVar27 = 0; uVar27 != uVar37; uVar27 = uVar27 + 1) {
          if ((pSVar6->a[uVar27].fg.jointype & 0x22) != 0) {
            if (uVar37 < uVar27 + 4) break;
            for (; pWVar21 != (WhereLoop *)0x0; pWVar21 = pWVar21->pNextLoop) {
              if ((byte)uVar27 < pWVar21->iTab) goto LAB_001867c9;
            }
            pWVar21 = (WhereLoop *)0x0;
          }
LAB_001867c9:
          iVar33 = 0;
          uVar29 = 0;
          pWVar24 = pWVar21;
          while ((pWVar24 != (WhereLoop *)0x0 &&
                 ((pSVar6->a[pWVar24->iTab].fg.jointype & 0x22) == 0))) {
            if (((pWVar24->prereq & uVar19) != 0) && ((pWVar24->maskSelf & (uVar29 | uVar28)) == 0))
            {
              if (pSVar6->a[pWVar24->iTab].pSTab == pSVar6->a[uVar27].pSTab) {
                uVar28 = uVar28 | uVar19;
              }
              else {
                iVar33 = iVar33 + 1;
                uVar29 = uVar29 | pWVar24->maskSelf;
              }
            }
            pWVar24 = pWVar24->pNextLoop;
          }
          if (3 < iVar33) {
            pWInfo->field_0x44 = pWInfo->field_0x44 | 0x20;
            uVar31 = 0x8000;
            for (pWVar24 = pWVar21; sVar30 = (short)uVar31, pWVar24 != (WhereLoop *)0x0;
                pWVar24 = pWVar24->pNextLoop) {
              uVar7 = uVar31;
              if (uVar27 <= pWVar24->iTab) {
                if (uVar27 < pWVar24->iTab) break;
                uVar7._0_2_ = pWVar24->rRun;
                uVar7._2_2_ = pWVar24->nOut;
                if ((short)(undefined2)uVar7 <= sVar30) {
                  uVar7 = uVar31;
                }
              }
              uVar31 = uVar7;
            }
            pWVar24 = pWVar21;
            sVar32 = sVar30 + 1;
            if (sVar30 == 0x7fff) {
              sVar32 = 0x7fff;
            }
            for (; pWVar24 != (WhereLoop *)0x0; pWVar24 = pWVar24->pNextLoop) {
              if ((((pWVar24->maskSelf & uVar29) != 0) && (pWVar24->nLTerm == 0)) &&
                 (pWVar24->rRun < sVar32)) {
                pWVar24->rRun = sVar32;
              }
            }
          }
          uVar19 = uVar19 * 2;
        }
      }
      uVar36 = 0x12;
      if ((pWInfo->field_0x44 & 0x20) == 0) {
        uVar36 = 0xc;
      }
    }
  }
  iVar33 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    iVar33 = pWInfo->pOrderBy->nExpr;
  }
  uVar35 = (uint)bVar2;
  p = (WherePath *)
      sqlite3DbMallocRawNN
                (pParse->db,(long)(int)((uVar35 * 0x10 + 0x40) * uVar36 + (int)((long)iVar33 * 2)));
  if (p == (WherePath *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    uVar19 = (ulong)(uVar36 << 5);
    pWVar34 = (WherePath *)((long)&p->maskLoop + uVar19);
    puVar1 = (undefined8 *)((long)&p->nRow + uVar19);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&p->maskLoop + uVar19);
    *puVar1 = 0;
    puVar1[1] = 0;
    local_c8 = (WhereLoop **)((long)&pWVar34->maskLoop + uVar19);
    pppWVar18 = &p->aLoop;
    for (iVar13 = uVar36 * 2; 0 < iVar13; iVar13 = iVar13 + -1) {
      *pppWVar18 = local_c8;
      pppWVar18 = pppWVar18 + 4;
      local_c8 = (WhereLoop **)((long)local_c8 + (ulong)(uVar35 * 8));
    }
    if (iVar33 == 0) {
      local_c8 = (WhereLoop **)0x0;
    }
    else {
      memset(local_c8,0,(long)iVar33 * 2);
    }
    uVar5 = pParse->nQueryLoop;
    sVar30 = 0x30;
    if ((short)uVar5 < 0x30) {
      sVar30 = uVar5;
    }
    pWVar34->nRow = sVar30;
    if (iVar33 != 0) {
      pWVar34->isOrdered = -(uVar35 != 0) | (byte)iVar33;
    }
    local_f0 = 1;
    uVar35 = 0;
    sVar32 = 0;
    sVar30 = 0;
    local_c0 = p;
    for (uVar19 = 0; pPath = pWVar34, uVar19 != uVar37; uVar19 = uVar19 + 1) {
      uVar26 = 0;
      uVar17 = local_f0;
      if ((int)local_f0 < 1) {
        uVar17 = uVar26;
      }
      local_f0 = 0;
      pWVar34 = pPath;
      for (; ppWVar15 = &pWInfo->pLoops, uVar26 != uVar17; uVar26 = uVar26 + 1) {
        while (pWVar21 = *ppWVar15, pWVar21 != (WhereLoop *)0x0) {
          revMask = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
          uVar27 = pWVar34->maskLoop;
          if ((((pWVar21->prereq & ~uVar27) == 0) &&
              (uVar28 = pWVar21->maskSelf, (uVar28 & uVar27) == 0)) &&
             ((sVar23 = pWVar34->nRow, (pWVar21->wsFlags & 0x4000) == 0 || (2 < sVar23)))) {
            LVar10 = pWVar21->rRun + sVar23;
            if (pWVar21->rSetup != 0) {
              LVar10 = sqlite3LogEstAdd(pWVar21->rSetup,LVar10);
            }
            LVar10 = sqlite3LogEstAdd(LVar10,pWVar34->rUnsort);
            sVar23 = sVar23 + pWVar21->nOut;
            bVar8 = pWVar34->isOrdered;
            if ((char)bVar8 < '\0') {
              revMask = 0;
              bVar8 = wherePathSatisfiesOrderBy
                                (pWInfo,pWInfo->pOrderBy,pWVar34,pWInfo->wctrlFlags,(u16)uVar19,
                                 pWVar21,&revMask);
            }
            else {
              revMask = pWVar34->revLoop;
            }
            iVar13 = iVar33 - (char)bVar8;
            if ((iVar13 == 0 || iVar33 < (char)bVar8) || (char)bVar8 < '\0') {
              LVar11 = LVar10 + -2;
              sVar20 = LVar10;
            }
            else {
              sVar20 = *(short *)((long)local_c8 + (ulong)bVar8 * 2);
              if (sVar20 == 0) {
                LVar11 = sqlite3LogEst((long)((pWInfo->pSelect->pEList->nExpr + 0x3b) / 0x1e));
                sVar20 = LVar11 + nRowEst;
                if (bVar8 != 0) {
                  LVar11 = sqlite3LogEst((long)((iVar13 * 100) / iVar33));
                  sVar20 = sVar20 + LVar11 + -0x42;
                }
                if ((pWInfo->wctrlFlags >> 0xe & 1) == 0) {
                  sVar12 = nRowEst;
                  if ((pWInfo->wctrlFlags & 0x100) != 0) {
                    sVar12 = nRowEst + -10;
                  }
                  if (nRowEst < 0xb) {
                    sVar12 = nRowEst;
                  }
                }
                else {
                  sVar12 = 10;
                  if (bVar8 != 0) {
                    sVar12 = 0x10;
                  }
                  sVar20 = sVar20 + sVar12;
                  sVar12 = pWInfo->iLimit;
                  if (nRowEst <= pWInfo->iLimit) {
                    sVar12 = nRowEst;
                  }
                }
                LVar11 = estLog(sVar12);
                sVar20 = sVar20 + LVar11;
                *(short *)((long)local_c8 + (ulong)bVar8 * 2) = sVar20;
              }
              LVar11 = sqlite3LogEstAdd(LVar10,sVar20);
              sVar20 = LVar11 + 3;
              LVar11 = LVar10;
            }
            pWVar25 = local_c0;
            uVar16 = 0;
            if (0 < (int)local_f0) {
              uVar16 = local_f0;
            }
            while (uVar16 != 0) {
              if ((pWVar25->maskLoop == (uVar28 | uVar27)) &&
                 (-1 < (char)(pWVar25->isOrdered ^ bVar8))) {
                if ((pWVar25->rCost < sVar20) ||
                   ((pWVar25->rCost == sVar20 &&
                    ((pWVar25->nRow < sVar23 ||
                     ((pWVar25->nRow == sVar23 &&
                      ((pWVar25->rUnsort < LVar11 ||
                       ((pWVar25->rUnsort == LVar11 &&
                        (iVar13 = whereLoopIsNoBetter(pWVar21,pWVar25->aLoop[uVar19]), iVar13 != 0))
                       )))))))))) goto LAB_00186de4;
                goto LAB_00186ce5;
              }
              pWVar25 = pWVar25 + 1;
              uVar16 = uVar16 - 1;
            }
            uVar16 = local_f0;
            if (((int)local_f0 < (int)uVar36) ||
               ((sVar20 <= sVar32 && ((uVar16 = uVar35, sVar20 != sVar32 || (LVar11 < sVar30)))))) {
              local_f0 = local_f0 + ((int)local_f0 < (int)uVar36);
              pWVar25 = local_c0 + (int)uVar16;
LAB_00186ce5:
              pWVar25->maskLoop = pWVar21->maskSelf | pWVar34->maskLoop;
              pWVar25->revLoop = revMask;
              pWVar25->nRow = sVar23;
              pWVar25->rCost = sVar20;
              pWVar25->rUnsort = LVar11;
              pWVar25->isOrdered = bVar8;
              memcpy(pWVar25->aLoop,pWVar34->aLoop,uVar19 * 8);
              pWVar25->aLoop[uVar19] = pWVar21;
              if ((int)uVar36 <= (int)local_f0) {
                sVar30 = local_c0->nRow;
                sVar32 = local_c0->rCost;
                uVar35 = 0;
                pLVar14 = &local_c0[1].rUnsort;
                for (uVar16 = 1; uVar16 < uVar36; uVar16 = uVar16 + 1) {
                  sVar23 = pLVar14[-1];
                  if (sVar32 < sVar23) {
                    uVar35 = uVar16;
                    sVar30 = *pLVar14;
                    sVar32 = sVar23;
                  }
                  else if ((sVar23 == sVar32) && (sVar30 < *pLVar14)) {
                    uVar35 = uVar16;
                    sVar30 = *pLVar14;
                    sVar32 = sVar23;
                  }
                  pLVar14 = pLVar14 + 0x10;
                }
              }
            }
          }
LAB_00186de4:
          ppWVar15 = &pWVar21->pNextLoop;
        }
        pWVar34 = pWVar34 + 1;
      }
      pWVar34 = local_c0;
      local_c0 = pPath;
    }
    if (local_f0 == 0) {
      sqlite3ErrorMsg(pParse,"no query solution");
    }
    else {
      pWVar34 = pPath;
      for (lVar22 = 1; lVar22 < (int)local_f0; lVar22 = lVar22 + 1) {
        pWVar25 = pWVar34 + 1;
        if (pPath->rCost <= pWVar34[1].rCost) {
          pWVar25 = pPath;
        }
        pPath = pWVar25;
        pWVar34 = pWVar34 + 1;
      }
      ppWVar15 = &pWInfo->a[0].pWLoop;
      for (uVar19 = 0; uVar37 != uVar19; uVar19 = uVar19 + 1) {
        pWVar21 = pPath->aLoop[uVar19];
        *ppWVar15 = pWVar21;
        bVar8 = pWVar21->iTab;
        *(byte *)(ppWVar15 + -4) = bVar8;
        *(int *)((long)ppWVar15 + -0x5c) = pWInfo->pTabList->a[bVar8].iCursor;
        ppWVar15 = ppWVar15 + 0xe;
      }
      if ((((pWInfo->wctrlFlags & 0x180) == 0x100) && (nRowEst != 0)) && (pWInfo->eDistinct == '\0')
         ) {
        revMask = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
        iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pResultSet,pPath,0x80,bVar2 - 1,pPath->aLoop[uVar37 - 1],
                           &revMask);
        if (pWInfo->pResultSet->nExpr == (int)iVar9) {
          pWInfo->eDistinct = '\x02';
        }
      }
      bVar8 = pWInfo->field_0x44;
      pWInfo->field_0x44 = bVar8 & 0xfb;
      pOrderBy = pWInfo->pOrderBy;
      if (pOrderBy != (ExprList *)0x0) {
        cVar3 = pPath->isOrdered;
        pWInfo->nOBSat = cVar3;
        uVar4 = pWInfo->wctrlFlags;
        uVar36 = (uint)uVar4;
        if ((char)uVar4 < '\0') {
          if (pOrderBy->nExpr == (int)cVar3) {
            pWInfo->eDistinct = '\x02';
          }
        }
        else {
          pWInfo->revMask = pPath->revLoop;
          if (cVar3 < '\x01') {
            pWInfo->nOBSat = '\0';
            if (uVar37 != 0) {
              uVar17 = bVar2 - 1;
              uVar35 = pPath->aLoop[uVar17]->wsFlags;
              if ((~uVar35 & 0x104) != 0 && (uVar35 >> 0xc & 1) == 0) {
                revMask = 0;
                iVar9 = wherePathSatisfiesOrderBy
                                  (pWInfo,pOrderBy,pPath,0x800,(u16)uVar17,pPath->aLoop[uVar17],
                                   &revMask);
                pOrderBy = pWInfo->pOrderBy;
                if (pOrderBy->nExpr == (int)iVar9) {
                  pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
                  pWInfo->revMask = revMask;
                }
                uVar36 = (uint)pWInfo->wctrlFlags;
              }
            }
          }
          else if (((uVar4 & 3) != 0 && uVar37 != 0) && cVar3 == '\x01') {
            pWInfo->field_0x44 = bVar8 | 4;
          }
        }
        if ((((uVar36 >> 9 & 1) != 0) && (uVar37 != 0)) && (pOrderBy->nExpr == (int)pWInfo->nOBSat))
        {
          revMask = 0;
          uVar36 = bVar2 - 1;
          iVar9 = wherePathSatisfiesOrderBy
                            (pWInfo,pOrderBy,pPath,0,(u16)uVar36,pPath->aLoop[uVar36],&revMask);
          if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
            pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
            pWInfo->revMask = revMask;
          }
        }
      }
      pWInfo->nRowOut = pPath->nRow;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3DbFreeNN(pParse->db,p);
      return extraout_EAX;
    }
  }
  __stack_chk_fail();
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsort = 0;      /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));
  /* TUNING: mxChoice is the maximum number of possible paths to preserve
  ** at each step.  Based on the number of loops in the FROM clause:
  **
  **     nLoop      mxChoice
  **     -----      --------
  **       1            1            // the most common case
  **       2            5
  **       3+        12 or 18        // see computeMxChoice()
  */
  if( nLoop<=1 ){
    mxChoice = 1;
  }else if( nLoop==2 ){
    mxChoice = 5;
  }else if( pParse->nErr ){
    mxChoice = 1;
  }else{
    mxChoice = computeMxChoice(pWInfo);
  }
  assert( nLoop<=pWInfo->pTabList->nSrc );

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsort;                   /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsort = pWLoop->rRun + pFrom->nRow;
        if( pWLoop->rSetup ){
          rUnsort = sqlite3LogEstAdd(pWLoop->rSetup, rUnsort);
        }
        rUnsort = sqlite3LogEstAdd(rUnsort, pFrom->rUnsort);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsort, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsort, rCost));
        }else{
          rCost = rUnsort;
          rUnsort -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        testcase( nTo==0 );
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsort>=mxUnsort))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsort) <= (rCost,nOut,rUnsort)
          */
          if( (pTo->rCost<rCost)
           || (pTo->rCost==rCost && pTo->nRow<nOut)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort<rUnsort)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort==rUnsort
                  && whereLoopIsNoBetter(pWLoop, pTo->aLoop[iLoop]) )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsort = rUnsort;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsort = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsort>mxUnsort)
            ){
              mxCost = pTo->rCost;
              mxUnsort = pTo->rUnsort;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      LogEst rMin, rFloor = 0;
      int nDone = 0;
      int nProgress;
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      do{
        nProgress = 0;
        rMin = 0x7fff;
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost>rFloor && pTo->rCost<rMin ) rMin = pTo->rCost;
        }
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost==rMin ){
            sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
               wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
               pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
            if( pTo->isOrdered>0 ){
              sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
            }else{
              sqlite3DebugPrintf("\n");
            }
            nDone++;
            nProgress++;
          }
        }
        rFloor = rMin;
      }while( nDone<nTo && nProgress>0 );
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;
#ifdef WHERETRACE_ENABLED
  pWInfo->rTotalCost = pFrom->rCost;
#endif

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}